

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O0

void __thiscall InfoListWnd::~InfoListWnd(InfoListWnd *this)

{
  LTImgWindow *in_RDI;
  
  (in_RDI->super_ImgWindow)._vptr_ImgWindow = (_func_int **)&PTR__InfoListWnd_0046bf40;
  gIlwState.activeTab = *(ILWTabTy *)&in_RDI[1].super_ImgWindow._vptr_ImgWindow;
  gIlwState.bFilterAcOnly = (bool)(*(byte *)(in_RDI[1].super_ImgWindow.mModelView + 2) & 1);
  strncpy(gIlwState.sAcFilter,(char *)(in_RDI[1].super_ImgWindow.mProjection + 6),0x32);
  gIlwState.msgLvlFilter = in_RDI[1].super_ImgWindow.mViewport[3];
  strncpy(gIlwState.sMsgFilter,(char *)&in_RDI[1].super_ImgWindow.mWindowTitle,0x32);
  gpILW = (InfoListWnd *)0x0;
  std::__cxx11::string::~string((string *)(in_RDI[2].super_ImgWindow.mModelView + 2));
  std::__cxx11::string::~string
            ((string *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
               *)&in_RDI[2].super_ImgWindow.mFirstRender)->_M_local_buf);
  std::__cxx11::string::~string((string *)&in_RDI[1].nextWinMode);
  std::__cxx11::string::~string((string *)&in_RDI[1].super_ImgWindow.dragBottom);
  std::__cxx11::
  list<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>::
  ~list((list<std::_List_const_iterator<LogMsgTy>,_std::allocator<std::_List_const_iterator<LogMsgTy>_>_>
         *)0x172714);
  ACTable::~ACTable((ACTable *)in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI[1].super_ImgWindow.mFirstRender);
  LTImgWindow::~LTImgWindow(in_RDI);
  return;
}

Assistant:

InfoListWnd::~InfoListWnd()
{
    // save state
    gIlwState.activeTab = activeTab;
    gIlwState.bFilterAcOnly = acList.bFilterAcOnly;
    strncpy(gIlwState.sAcFilter, sAcFilter, sizeof(gIlwState.sAcFilter));
    gIlwState.msgLvlFilter = msgLvlFilter;
    strncpy(gIlwState.sMsgFilter, sMsgFilter, sizeof(gIlwState.sMsgFilter));

    // I am no longer
    gpILW = nullptr;
}